

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall MxxColl_ScattervConvenience_Test::TestBody(MxxColl_ScattervConvenience_Test *this)

{
  pointer out;
  unsigned_long uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  AssertHelper local_f0;
  AssertionResult gtest_ar;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> result;
  comm c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  vector<int,_std::allocator<int>_> vec;
  
  gtest_ar._0_8_ = &ompi_mpi_comm_world;
  mxx::comm::comm(&c,(MPI_Comm *)&gtest_ar);
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (c.m_rank == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&sizes,(long)c.m_size);
    lVar5 = 1;
    iVar2 = 0;
    uVar1 = 0;
    while ((long)uVar1 < (long)c.m_size) {
      sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] = uVar1 + 1;
      lVar4 = lVar5;
      iVar6 = iVar2;
      while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
        gtest_ar._0_4_ = iVar6;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&vec,(int *)&gtest_ar);
        iVar6 = iVar6 + 0xd;
      }
      lVar5 = lVar5 + 1;
      iVar2 = iVar2 + -0x17;
      uVar1 = uVar1 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&result,(long)(c.m_rank + 1),(allocator_type *)&gtest_ar);
  lVar5 = (long)c.m_rank;
  if (lVar5 == 0) {
    mxx::scatterv<int>(vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,&sizes,
                       result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,1,0,&c);
  }
  else {
    local_f0.data_ = (AssertHelperData *)&ompi_mpi_comm_world;
    mxx::comm::comm((comm *)&gtest_ar,(MPI_Comm *)&local_f0);
    mxx::scatterv_recv<int>
              ((vector<int,_std::allocator<int>_> *)&local_c8,lVar5 + 1,0,(comm *)&gtest_ar);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&result,&local_c8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
    mxx::comm::~comm((comm *)&gtest_ar);
  }
  lVar4 = 0;
  iVar2 = 0;
  for (lVar5 = 0;
      lVar5 < (int)((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2); lVar5 = lVar5 + 1) {
    local_c8._M_impl.super__Vector_impl_data._M_start._0_4_ = c.m_rank * -0x17 + iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"13*j+-23*c.rank()","result[j]",(int *)&local_c8,
               (int *)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar4));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_c8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0xb0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_c8);
      goto LAB_001107af;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    iVar2 = iVar2 + 0xd;
    lVar4 = lVar4 + 4;
  }
  mxx::scatterv<int>((vector<int,_std::allocator<int>_> *)&gtest_ar,
                     vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,&sizes,(long)c.m_rank + 1,0,&c);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&result,&gtest_ar);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&gtest_ar);
  local_c8._M_impl.super__Vector_impl_data._M_start._0_4_ = c.m_rank + 1;
  local_f0.data_._0_4_ =
       (int)((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"c.rank()+1","(int)result.size()",(int *)&local_c8,
             (int *)&local_f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
               ,0xb5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_c8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar4 = 0;
    iVar2 = 0;
    for (lVar5 = 0;
        lVar5 < (int)((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2); lVar5 = lVar5 + 1) {
      local_c8._M_impl.super__Vector_impl_data._M_start._0_4_ = c.m_rank * -0x17 + iVar2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"13*j-23*c.rank()","result[j]",(int *)&local_c8,
                 (int *)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar4));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c8);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                   ,0xb7,pcVar3);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_c8);
        goto LAB_001107af;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      iVar2 = iVar2 + 0xd;
      lVar4 = lVar4 + 4;
    }
    if ((long)c.m_rank == 0) {
      mxx::scatterv<int>((vector<int,_std::allocator<int>_> *)&gtest_ar,
                         vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,&sizes,1,0,&c);
      std::vector<int,_std::allocator<int>_>::_M_move_assign(&result,&gtest_ar);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&gtest_ar);
    }
    else {
      std::vector<int,_std::allocator<int>_>::resize(&result,(long)c.m_rank + 1);
      out = result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
      lVar5 = (long)c.m_rank;
      mxx::comm::comm((comm *)&gtest_ar);
      mxx::scatterv_recv<int>(out,lVar5 + 1,0,(comm *)&gtest_ar);
      mxx::comm::~comm((comm *)&gtest_ar);
    }
    local_c8._M_impl.super__Vector_impl_data._M_start._0_4_ = c.m_rank + 1;
    local_f0.data_._0_4_ =
         (int)((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"c.rank()+1","(int)result.size()",(int *)&local_c8,
               (int *)&local_f0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_c8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0xbf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_c8);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar4 = 0;
      iVar2 = 0;
      for (lVar5 = 0;
          lVar5 < (int)((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2); lVar5 = lVar5 + 1) {
        local_c8._M_impl.super__Vector_impl_data._M_start._0_4_ = c.m_rank * -0x17 + iVar2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"13*j-23*c.rank()","result[j]",(int *)&local_c8,
                   (int *)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar4));
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                     ,0xc1,pcVar3);
          testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_c8);
          goto LAB_001107af;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        iVar2 = iVar2 + 0xd;
        lVar4 = lVar4 + 4;
      }
      mxx::scatterv<int>((vector<int,_std::allocator<int>_> *)&gtest_ar,&vec,&sizes,
                         (long)c.m_rank + 1,0,&c);
      std::vector<int,_std::allocator<int>_>::_M_move_assign(&result,&gtest_ar);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&gtest_ar);
      local_c8._M_impl.super__Vector_impl_data._M_start._0_4_ = c.m_rank + 1;
      local_f0.data_._0_4_ =
           (int)((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"c.rank()+1","(int)result.size()",(int *)&local_c8,
                 (int *)&local_f0);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar4 = 0;
        iVar2 = 0;
        lVar5 = 0;
LAB_0011061e:
        if (lVar5 < (int)((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_finish -
                                 (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2)) {
          local_c8._M_impl.super__Vector_impl_data._M_start._0_4_ = c.m_rank * -0x17 + iVar2;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"13*j-23*c.rank()","result[j]",(int *)&local_c8,
                     (int *)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar4));
          if (gtest_ar.success_ != false) goto code_r0x00110669;
          testing::Message::Message((Message *)&local_c8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                     ,200,pcVar3);
          testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_c8);
LAB_001107af:
          testing::internal::AssertHelper::~AssertHelper(&local_f0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_c8);
          goto LAB_001107c8;
        }
        goto LAB_001107cd;
      }
      testing::Message::Message((Message *)&local_c8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0xc6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_c8);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_f0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c8);
LAB_001107c8:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
LAB_001107cd:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&result.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vec.super__Vector_base<int,_std::allocator<int>_>);
  mxx::comm::~comm(&c);
  return;
code_r0x00110669:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  lVar5 = lVar5 + 1;
  iVar2 = iVar2 + 0xd;
  lVar4 = lVar4 + 4;
  goto LAB_0011061e;
}

Assistant:

TEST(MxxColl, ScattervConvenience) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from 0
    if (c.rank() == 0) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            sizes[i] = i+1;
            for (size_t j = 0; j < (size_t)(i+1); ++j)
            {
                vec.push_back(13*j + -23*i);
            }
        }
    }

    // test general case with recv
    std::vector<int> result(c.rank()+1);
    if (c.rank() == 0)
        mxx::scatterv(&vec[0], sizes, &result.front(), c.rank()+1, 0, c);
    else
        result = mxx::scatterv_recv<int>(c.rank()+1, 0, MPI_COMM_WORLD);
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j+-23*c.rank(), result[j]);
    }

    // test convenience functions
    result = mxx::scatterv(&vec[0], sizes, c.rank()+1, 0, c);
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }
    if (c.rank() == 0)
        result = mxx::scatterv(&vec[0], sizes, c.rank()+1, 0, c);
    else {
        result.resize(c.rank() + 1);
        mxx::scatterv_recv(&result.front(), c.rank()+1, 0);
    }
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }

    // test convenience functions
    result = mxx::scatterv(vec, sizes, c.rank()+1, 0, c);
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }
}